

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O1

int __thiscall QtMWidgets::ToolBarLayout::indexOf(ToolBarLayout *this,QAction *action)

{
  long lVar1;
  int iVar2;
  int unaff_EBP;
  long lVar3;
  bool bVar4;
  
  iVar2 = -1;
  if (0 < (this->buttons).d.size) {
    lVar3 = 0;
    do {
      (**(code **)(*(long *)(this->buttons).d.ptr[lVar3] + 0x68))();
      lVar1 = QMetaObject::cast((QObject *)&ToolButton::staticMetaObject);
      if (lVar1 == 0) {
        bVar4 = true;
      }
      else {
        bVar4 = *(QAction **)(*(long *)(lVar1 + 0x28) + 8) != action;
        if (!bVar4) {
          unaff_EBP = (int)lVar3 + 1;
        }
      }
      iVar2 = unaff_EBP;
    } while ((bVar4) && (lVar3 = lVar3 + 1, iVar2 = -1, lVar3 < (this->buttons).d.size));
  }
  return iVar2;
}

Assistant:

int
ToolBarLayout::indexOf( QAction * action ) const
{
	for( int i = 0; i < buttons.count(); ++i )
	{
		ToolButton * b = qobject_cast< ToolButton* >
			( buttons.at( i )->widget() );

		if( b && b->action() == action )
			return i + 1;
	}

	return -1;
}